

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O0

ArgumentDirection slang::ast::SemanticFacts::getDirection(TokenKind kind)

{
  TokenKind kind_local;
  undefined4 local_4;
  
  if (kind == InOutKeyword) {
    local_4 = InOut;
  }
  else if (kind == InputKeyword) {
    local_4 = In;
  }
  else if (kind == OutputKeyword) {
    local_4 = Out;
  }
  else {
    local_4 = Ref;
  }
  return local_4;
}

Assistant:

ArgumentDirection SemanticFacts::getDirection(TokenKind kind) {
    switch (kind) {
        case TokenKind::InputKeyword: return ArgumentDirection::In;
        case TokenKind::InOutKeyword: return ArgumentDirection::InOut;
        case TokenKind::OutputKeyword: return ArgumentDirection::Out;
        case TokenKind::RefKeyword: return ArgumentDirection::Ref;
        default: SLANG_UNREACHABLE;
    }
}